

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void __thiscall
duckdb::BitpackingState<signed_char,_signed_char>::CalculateDeltaStats
          (BitpackingState<signed_char,_signed_char> *this)

{
  char *pcVar1;
  bool bVar2;
  ulong uVar3;
  int64_t i;
  long lVar4;
  int8_t right;
  int8_t left;
  int64_t i_1;
  char bogus;
  int8_t local_19;
  
  if ((1 < this->compression_buffer_idx) && (this->all_valid == true)) {
    bVar2 = TrySubtractOperator::Operation<signed_char,signed_char,signed_char>
                      (this->minimum,this->maximum,&local_19);
    if ((bVar2) &&
       (bVar2 = TrySubtractOperator::Operation<signed_char,signed_char,signed_char>
                          (this->maximum,this->minimum,&local_19), bVar2)) {
      pcVar1 = this->compression_buffer;
      for (lVar4 = 0; uVar3 = this->compression_buffer_idx, lVar4 < (long)uVar3; lVar4 = lVar4 + 1)
      {
        this->delta_buffer[lVar4] = pcVar1[lVar4] - pcVar1[lVar4 + -1];
      }
LAB_004c237e:
      this->can_do_delta = true;
      right = this->minimum_delta;
      left = this->maximum_delta;
      for (lVar4 = 0x811; lVar4 - 0x810U < uVar3; lVar4 = lVar4 + 1) {
        if (left <= this->compression_buffer_internal[lVar4]) {
          left = this->compression_buffer_internal[lVar4];
        }
        this->maximum_delta = left;
        if (this->compression_buffer_internal[lVar4] <= right) {
          right = this->compression_buffer_internal[lVar4];
        }
        this->minimum_delta = right;
      }
      this->delta_buffer[0] = right;
      bVar2 = TrySubtractOperator::Operation<signed_char,signed_char,signed_char>
                        (left,right,&this->min_max_delta_diff);
      this->can_do_delta = bVar2;
      if (bVar2) {
        bVar2 = TrySubtractOperator::Operation<signed_char,signed_char,signed_char>
                          (*this->compression_buffer,this->minimum_delta,&this->delta_offset);
      }
      else {
        bVar2 = false;
      }
      this->can_do_delta = bVar2;
    }
    else {
      lVar4 = 0;
      do {
        uVar3 = this->compression_buffer_idx;
        if ((long)uVar3 <= lVar4) goto LAB_004c237e;
        bVar2 = TrySubtractOperator::Operation<signed_char,signed_char,signed_char>
                          (this->compression_buffer[lVar4],this->compression_buffer[lVar4 + -1],
                           this->delta_buffer + lVar4);
        lVar4 = lVar4 + 1;
      } while (bVar2);
    }
  }
  return;
}

Assistant:

void CalculateDeltaStats() {
		// TODO: currently we dont support delta compression of values above NumericLimits<T_S>::Maximum(),
		// 		 we could support this with some clever substract trickery?
		if (maximum > static_cast<T>(NumericLimits<T_S>::Maximum())) {
			return;
		}

		// Don't delta encoding 1 value makes no sense
		if (compression_buffer_idx < 2) {
			return;
		}

		// TODO: handle NULLS here?
		// Currently we cannot handle nulls because we would need an additional step of patching for this.
		// we could for example copy the last value on a null insert. This would help a bit, but not be optimal for
		// large deltas since theres suddenly a zero then. Ideally we would insert a value that leads to a delta within
		// the current domain of deltas however we dont know that domain here yet
		if (!all_valid) {
			return;
		}

		// Note: since we dont allow any values over NumericLimits<T_S>::Maximum(), all subtractions for unsigned types
		// are guaranteed not to overflow
		bool can_do_all = true;
		if (NumericLimits<T>::IsSigned()) {
			T_S bogus;
			can_do_all = TrySubtractOperator::Operation(static_cast<T_S>(minimum), static_cast<T_S>(maximum), bogus) &&
			             TrySubtractOperator::Operation(static_cast<T_S>(maximum), static_cast<T_S>(minimum), bogus);
		}

		// Calculate delta's
		// compression_buffer pointer points one element ahead of the internal buffer making the use of signed index
		// integer (-1) possible
		D_ASSERT(compression_buffer_idx <= NumericLimits<int64_t>::Maximum());
		if (can_do_all) {
			for (int64_t i = 0; i < static_cast<int64_t>(compression_buffer_idx); i++) {
				delta_buffer[i] = static_cast<T_S>(compression_buffer[i]) - static_cast<T_S>(compression_buffer[i - 1]);
			}
		} else {
			for (int64_t i = 0; i < static_cast<int64_t>(compression_buffer_idx); i++) {
				auto success =
				    TrySubtractOperator::Operation(static_cast<T_S>(compression_buffer[i]),
				                                   static_cast<T_S>(compression_buffer[i - 1]), delta_buffer[i]);
				if (!success) {
					return;
				}
			}
		}

		can_do_delta = true;

		for (idx_t i = 1; i < compression_buffer_idx; i++) {
			maximum_delta = MaxValue<T_S>(maximum_delta, delta_buffer[i]);
			minimum_delta = MinValue<T_S>(minimum_delta, delta_buffer[i]);
		}

		// Since we can set the first value arbitrarily, we want to pick one from the current domain, note that
		// we will store the original first value - this offset as the  delta_offset to be able to decode this again.
		delta_buffer[0] = minimum_delta;

		can_do_delta = can_do_delta && TrySubtractOperator::Operation(maximum_delta, minimum_delta, min_max_delta_diff);
		can_do_delta = can_do_delta && TrySubtractOperator::Operation(static_cast<T_S>(compression_buffer[0]),
		                                                              minimum_delta, delta_offset);
	}